

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::openFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  char cVar1;
  uint src;
  uint uVar2;
  _Ios_Openmode _Var3;
  basic_fstream<char,_std::char_traits<char>_> *__p;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string filename;
  ForthFile createdFile;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  basic_fstream<char,_std::char_traits<char>_> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  requireDStackDepth(this,3,"OPEN-FILE");
  this_00 = &this->dStack;
  src = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  _Var3 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  moveFromDataSpace(this,&local_88,src,(ulong)uVar2);
  __p = (basic_fstream<char,_std::char_traits<char>_> *)operator_new(0x210);
  std::fstream::fstream(__p,(string *)&local_88,_Var3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::fstream*>(&local_90,__p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    ForthStack<unsigned_int>::setTop(this_00,1,0);
    ForthStack<unsigned_int>::setTop(this_00,0xffffffbb);
  }
  else {
    local_68._0_4_ = this->fileHandle + 1;
    this->fileHandle = local_68._0_4_;
    local_68._4_4_ = _Var3;
    local_60._M_p = (pointer)&local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_38._M_pi = local_90._M_pi;
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
      }
    }
    local_40 = __p;
    std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::push_back
              (&this->OpenFiles,(value_type *)local_68);
    ForthStack<unsigned_int>::setTop(this_00,1,this->fileHandle);
    ForthStack<unsigned_int>::setTop(this_00,0);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_p != &local_50) {
      operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
    }
  }
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void openFile() {
	REQUIRE_DSTACK_DEPTH(3, "OPEN-FILE");

	auto caddr = dStack.getTop(2);
	auto length = SIZE_T(dStack.getTop(1));
	auto fam = static_cast<std::ios_base::openmode>(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	try{
		std::shared_ptr<std::fstream> f{ new std::fstream(filename, fam) };
		if (f->is_open()) {
			//auto filesize = std::filesystem::file_size(filename);
			ForthFile createdFile{  ++fileHandle, fam,  filename, f };
			OpenFiles.push_back(createdFile);
			dStack.setTop(1, fileHandle);
			dStack.setTop(0);
		}
		else {
			dStack.setTop(1, 0);
			dStack.setTop(Cell(errorOpenFile));
		}
	}
	catch (std::exception &) {
		dStack.setTop(1, 0);
		dStack.setTop(Cell(errorOpenFile));
	}
}